

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall
streams_tests::streams_serializedata_xor::test_method(streams_serializedata_xor *this)

{
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  undefined1 uVar2;
  DataStream *this_00;
  long in_FS_OFFSET;
  DataStream ds_2;
  DataStream ds_1;
  DataStream ds;
  vector<std::byte,_std::allocator<std::byte>_> in;
  char *in_stack_fffffffffffffc38;
  lazy_ostream *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  DataStream *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  lazy_ostream *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  size_t line_num;
  const_string *in_stack_fffffffffffffc70;
  const_string *file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  DataStream *in_stack_fffffffffffffc88;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [71];
  const_string local_281 [4];
  undefined1 local_232;
  undefined1 local_231;
  undefined1 local_230 [16];
  undefined1 local_220 [150];
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188 [16];
  undefined1 local_178 [144];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  lazy_ostream local_c8 [2];
  undefined1 local_a8 [32];
  lazy_ostream local_88 [2];
  undefined1 local_68 [32];
  lazy_ostream local_48 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffc48,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  sp.m_size = in_stack_fffffffffffffc68;
  sp.m_data = (byte *)in_stack_fffffffffffffc60;
  DataStream::DataStream(in_stack_fffffffffffffc50,sp);
  local_ca = 0;
  local_c9 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  __l._M_array._7_1_ = in_stack_fffffffffffffc87;
  __l._M_array._0_7_ = in_stack_fffffffffffffc80;
  __l._M_len = (size_type)in_stack_fffffffffffffc88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc78,__l,(allocator_type *)in_stack_fffffffffffffc70);
  DataStream::Xor((DataStream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50
                 );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,(const_string *)in_stack_fffffffffffffc60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc40,(char (*) [1])in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    s_abi_cxx11_((char *)in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
    DataStream::str_abi_cxx11_(in_stack_fffffffffffffc88);
    in_stack_fffffffffffffc48 = "ds.str()";
    in_stack_fffffffffffffc40 = local_48;
    in_stack_fffffffffffffc38 = "\"\"s";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_178,local_188,0xe5,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffc38);
  local_189 = 0xf;
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38,
             (value_type *)0xb04b63);
  local_18a = 0xf0;
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38,
             (value_type *)0xb04b82);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffc48,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  sp_00.m_size = in_stack_fffffffffffffc68;
  sp_00.m_data = (byte *)in_stack_fffffffffffffc60;
  DataStream::DataStream(in_stack_fffffffffffffc50,sp_00);
  local_cb = 0xff;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  __l_00._M_array._7_1_ = in_stack_fffffffffffffc87;
  __l_00._M_array._0_7_ = in_stack_fffffffffffffc80;
  __l_00._M_len = (size_type)in_stack_fffffffffffffc88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc78,__l_00,(allocator_type *)in_stack_fffffffffffffc70);
  DataStream::Xor((DataStream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50
                 );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,(const_string *)in_stack_fffffffffffffc60);
    this_00 = (DataStream *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc40,(char (*) [1])in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    s_abi_cxx11_((char *)in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
    DataStream::str_abi_cxx11_(this_00);
    in_stack_fffffffffffffc48 = "ds.str()";
    in_stack_fffffffffffffc40 = local_88;
    in_stack_fffffffffffffc38 = "\"\\xf0\\x0f\"s";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_220,local_230,0xef,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc38);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffc38);
  this_01 = &local_e8;
  std::vector<std::byte,_std::allocator<std::byte>_>::clear
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38);
  local_231 = 0xf0;
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38,
             (value_type *)0xb04de0);
  local_232 = 0xf;
  std::vector<std::byte,_std::allocator<std::byte>_>::push_back
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc38,
             (value_type *)0xb04dff);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffc48,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  sp_01.m_size = in_stack_fffffffffffffc68;
  sp_01.m_data = (byte *)in_stack_fffffffffffffc60;
  DataStream::DataStream(in_stack_fffffffffffffc50,sp_01);
  local_cd = 0xff;
  local_cc = 0xf;
  file = local_281;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  __l_01._M_array._7_1_ = uVar2;
  __l_01._M_array._0_7_ = in_stack_fffffffffffffc80;
  __l_01._M_len = (size_type)this_00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,__l_01,(allocator_type *)file);
  DataStream::Xor((DataStream *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50
                 );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc38);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,file,line_num,(const_string *)in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc60 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc40,(char (*) [1])in_stack_fffffffffffffc38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48,
               (pointer)in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38);
    s_abi_cxx11_((char *)this_01,(size_t)file);
    DataStream::str_abi_cxx11_(this_00);
    in_stack_fffffffffffffc48 = "ds.str()";
    in_stack_fffffffffffffc40 = local_c8;
    in_stack_fffffffffffffc38 = "\"\\x0f\\x00\"s";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_2c8,local_2d8,0xfb,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffc38);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_serializedata_xor)
{
    std::vector<std::byte> in;

    // Degenerate case
    {
        DataStream ds{in};
        ds.Xor({0x00, 0x00});
        BOOST_CHECK_EQUAL(""s, ds.str());
    }

    in.push_back(std::byte{0x0f});
    in.push_back(std::byte{0xf0});

    // Single character key
    {
        DataStream ds{in};
        ds.Xor({0xff});
        BOOST_CHECK_EQUAL("\xf0\x0f"s, ds.str());
    }

    // Multi character key

    in.clear();
    in.push_back(std::byte{0xf0});
    in.push_back(std::byte{0x0f});

    {
        DataStream ds{in};
        ds.Xor({0xff, 0x0f});
        BOOST_CHECK_EQUAL("\x0f\x00"s, ds.str());
    }
}